

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_loo_norm
          (default_cost_type<long_double> *this,int n)

{
  longdouble __x;
  bool bVar1;
  pointer __first;
  pointer plVar2;
  longdouble *plVar3;
  type plVar4;
  int local_2c;
  int i;
  longdouble div;
  int n_local;
  default_cost_type<long_double> *this_local;
  
  __first = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                      (&this->linear_elements);
  plVar2 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                     (&this->linear_elements);
  plVar3 = std::max_element<long_double*>(__first,plVar2 + n);
  __x = *plVar3;
  bVar1 = std::isnormal(__x);
  if (bVar1) {
    for (local_2c = 0; local_2c != n; local_2c = local_2c + 1) {
      plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)local_2c);
      *plVar4 = *plVar4 / __x;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }